

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_htmlentities(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  int nLen_00;
  int *zString;
  jx9_value *pjVar5;
  char *pcVar6;
  uint uVar7;
  int c;
  int nLen;
  int local_38;
  int local_34;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    pcVar3 = jx9_value_to_string(*apArg,&local_34);
    uVar7 = 0;
    if (nArg != 1) {
      pjVar5 = apArg[1];
      jx9MemObjToInteger(pjVar5);
      uVar2 = *(uint *)&pjVar5->x;
      uVar7 = 0;
      if (-1 < (int)uVar2) {
        uVar7 = uVar2;
      }
    }
    if (0 < local_34) {
      pcVar6 = pcVar3 + local_34;
      do {
        cVar1 = *pcVar3;
        local_38 = (int)cVar1;
        uVar4 = 0xfffffffffffffffe;
        do {
          if (cVar1 == *azHtmlEscape[uVar4 + 3]) {
            if (((cVar1 != '\"') || ((uVar7 & 4) == 0)) && ((cVar1 != '\'' || ((uVar7 & 6) == 2))))
            {
              zString = (int *)azHtmlEscape[uVar4 + 2];
              pjVar5 = pCtx->pRet;
              nLen_00 = -1;
              goto LAB_001308fc;
            }
            break;
          }
          uVar4 = uVar4 + 2;
        } while (uVar4 < 0x26);
        pjVar5 = pCtx->pRet;
        nLen_00 = 1;
        zString = &local_38;
LAB_001308fc:
        jx9_value_string(pjVar5,(char *)zString,nLen_00);
        pcVar3 = pcVar3 + 1;
      } while (pcVar3 < pcVar6);
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_htmlentities(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iFlags = 0x01; /* ENT_COMPAT */
	const char *zIn, *zEnd;
	int nLen, c;
	sxu32 n;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	/* Extract the flags if available */
	if( nArg > 1 ){
		iFlags = jx9_value_to_int(apArg[1]);
		if( iFlags < 0 ){
			iFlags = 0x01;
		}
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		c = zIn[0];
		/* Perform a linear lookup on the decoding table */
		for( n = 0 ; n < SX_ARRAYSIZE(azHtmlEscape) ; n += 2 ){
			if( azHtmlEscape[n+1][0] == c ){
				/* Got one */
				break;
			}
		}
		if( n < SX_ARRAYSIZE(azHtmlEscape) ){
			/* Output the safe sequence [i.e: '<' ==> '&lt;"] */
			if( c == '"' && (iFlags & 0x04) /*ENT_NOQUOTES*/ ){
				/* Expand the double quote verbatim */
				jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			}else if(c == '\'' && ((iFlags & 0x02 /*ENT_QUOTES*/) == 0 || (iFlags & 0x04) /*ENT_NOQUOTES*/) ){
				/* expand single quote verbatim */
				jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			}else{
				jx9_result_string(pCtx, azHtmlEscape[n], -1/*Compute length automatically */);
			}
		}else{
			/* Output character verbatim */
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
		}
		zIn++;
	}
	return JX9_OK;
}